

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_begin_2d(rf_camera2d camera)

{
  rf_mat *prVar1;
  rf_context *prVar2;
  rf_float16 buffer_1;
  rf_float16 buffer;
  undefined1 in_stack_00000140 [24];
  float local_88 [16];
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  rf_gfx_draw();
  prVar2 = rf__ctx;
  prVar1 = (rf__ctx->field_0).current_matrix;
  prVar1->m0 = 1.0;
  prVar1->m4 = 0.0;
  prVar1->m8 = 0.0;
  prVar1->m12 = 0.0;
  prVar1->m1 = 0.0;
  prVar1->m5 = 1.0;
  prVar1->m9 = 0.0;
  prVar1->m13 = 0.0;
  prVar1->m2 = 0.0;
  prVar1->m6 = 0.0;
  prVar1->m10 = 1.0;
  prVar1->m14 = 0.0;
  prVar1->m3 = 0.0;
  prVar1->m7 = 0.0;
  prVar1->m11 = 0.0;
  prVar1->m15 = 1.0;
  local_48 = (prVar2->field_0).screen_scaling.m0;
  local_38 = (prVar2->field_0).screen_scaling.m4;
  local_28 = (prVar2->field_0).screen_scaling.m8;
  local_18 = (prVar2->field_0).screen_scaling.m12;
  local_44 = (prVar2->field_0).screen_scaling.m1;
  local_34 = (prVar2->field_0).screen_scaling.m5;
  local_24 = (prVar2->field_0).screen_scaling.m9;
  local_14 = (prVar2->field_0).screen_scaling.m13;
  local_40 = (prVar2->field_0).screen_scaling.m2;
  local_30 = (prVar2->field_0).screen_scaling.m6;
  local_20 = (prVar2->field_0).screen_scaling.m10;
  local_10 = (prVar2->field_0).screen_scaling.m14;
  local_3c = (prVar2->field_0).screen_scaling.m3;
  local_2c = (prVar2->field_0).screen_scaling.m7;
  local_1c = (prVar2->field_0).screen_scaling.m11;
  local_c = (prVar2->field_0).screen_scaling.m15;
  rf_gfx_mult_matrixf(&local_48);
  rf_get_camera_matrix2d((rf_camera2d)in_stack_00000140);
  rf_gfx_mult_matrixf(local_88);
  return;
}

Assistant:

RF_API void rf_begin_2d(rf_camera2d camera)
{
    rf_gfx_draw();

    rf_gfx_load_identity(); // Reset current matrix (MODELVIEW)

    // Apply screen scaling if required
    rf_gfx_mult_matrixf(rf_mat_to_float16(rf_ctx.screen_scaling).v);

    // Apply 2d camera transformation to rf_gfxobal_model_view
    rf_gfx_mult_matrixf(rf_mat_to_float16(rf_get_camera_matrix2d(camera)).v);
}